

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O3

int SUNLinSolFree_Dense(SUNLinearSolver S)

{
  void *__ptr;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr = S->content;
    if (__ptr != (void *)0x0) {
      if (*(void **)((long)__ptr + 8) != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
        __ptr = S->content;
        *(undefined8 *)((long)__ptr + 8) = 0;
      }
      free(__ptr);
      S->content = (void *)0x0;
    }
    if (S->ops != (SUNLinearSolver_Ops)0x0) {
      free(S->ops);
    }
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_Dense(SUNLinearSolver S)
{
  /* return if S is already free */
  if (S == NULL) return(SUNLS_SUCCESS);

  /* delete items from contents, then delete generic structure */
  if (S->content) {
    if (PIVOTS(S)) {
      free(PIVOTS(S));
      PIVOTS(S) = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops) {
    free(S->ops);
    S->ops = NULL;
  }
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}